

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_Downloader.h
# Opt level: O1

void __thiscall Ui_Downloader::retranslateUi(Ui_Downloader *this,QWidget *Downloader)

{
  QLabel *pQVar1;
  QPushButton *pQVar2;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  QCoreApplication::translate((char *)&local_38,"Downloader","Updater",0);
  QWidget::setWindowTitle((QString *)Downloader);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  QLabel::setText((QString *)this->updater_icon);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  pQVar1 = this->downloadLabel;
  QCoreApplication::translate((char *)&local_38,"Downloader","Downloading updates",0);
  QLabel::setText((QString *)pQVar1);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  pQVar1 = this->timeLabel;
  QCoreApplication::translate((char *)&local_38,"Downloader","Time remaining: 0 minutes",0);
  QLabel::setText((QString *)pQVar1);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  pQVar2 = this->openButton;
  QCoreApplication::translate((char *)&local_38,"Downloader","Open",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  pQVar2 = this->stopButton;
  QCoreApplication::translate((char *)&local_38,"Downloader","Stop",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  return;
}

Assistant:

void retranslateUi(QWidget *Downloader)
    {
        Downloader->setWindowTitle(QCoreApplication::translate("Downloader", "Updater", nullptr));
        updater_icon->setText(QString());
        downloadLabel->setText(QCoreApplication::translate("Downloader", "Downloading updates", nullptr));
        timeLabel->setText(QCoreApplication::translate("Downloader", "Time remaining: 0 minutes", nullptr));
        openButton->setText(QCoreApplication::translate("Downloader", "Open", nullptr));
        stopButton->setText(QCoreApplication::translate("Downloader", "Stop", nullptr));
    }